

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3376::ProfileDataTest_StartResetRestart_Test::TestBody
          (ProfileDataTest_StartResetRestart_Test *this)

{
  ProfileData *this_00;
  ProfileDataChecker *this_01;
  bool bVar1;
  char *in_R9;
  char *pcVar2;
  undefined1 local_148 [8];
  stat statbuf;
  ProfileDataSlot slots [8];
  Options options;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  AssertionResult gtest_ar__1;
  
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  ProfileData::Options::Options((Options *)((long)slots + 0x3c));
  slots[7]._4_4_ = 1;
  this_00 = &(this->super_ProfileDataTest).collector_;
  this_01 = &(this->super_ProfileDataTest).checker_;
  std::__cxx11::string::string((string *)local_148,(string *)this_01);
  bVar1 = ProfileData::Start(this_00,(char *)local_148,(Options *)((long)slots + 0x3c));
  statbuf.__glibc_reserved[2] = CONCAT71(statbuf.__glibc_reserved[2]._1_7_,bVar1);
  slots[0] = 0;
  std::__cxx11::string::~string((string *)local_148);
  if ((char)statbuf.__glibc_reserved[2] == '\0') {
    testing::Message::Message((Message *)local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)(statbuf.__glibc_reserved + 2),
               (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x21c,(char *)local_148);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)local_148);
    if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)slots);
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  ProfileData::Reset(this_00);
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_((string *)local_148,this_01)
  ;
  pcVar2 = "";
  testing::internal::CmpHelperNE<char[1],std::__cxx11::string>
            ((internal *)(statbuf.__glibc_reserved + 2),"kNoError","checker_.ValidateProfile()",
             (char (*) [1])"",(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  if ((char)statbuf.__glibc_reserved[2] == '\0') {
    testing::Message::Message((Message *)local_148);
    if (slots[0] != 0) {
      pcVar2 = *(char **)slots[0];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x222,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_148 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_148 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)slots);
  local_48.data_._0_4_ = 0;
  std::__cxx11::string::string((string *)(statbuf.__glibc_reserved + 2),(string *)this_01);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = stat((char *)statbuf.__glibc_reserved[2],(stat *)local_148);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_68,"0","stat(checker_.filename().c_str(), &statbuf)",(int *)&local_48
             ,(int *)&gtest_ar__1.message_);
  std::__cxx11::string::~string((string *)(statbuf.__glibc_reserved + 2));
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)(statbuf.__glibc_reserved + 2));
    if (gtest_ar_1._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x225,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)(statbuf.__glibc_reserved + 2));
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (statbuf.__glibc_reserved[2] != 0) {
      (**(code **)(*(long *)statbuf.__glibc_reserved[2] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_1);
  local_68._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)(statbuf.__glibc_reserved + 2),"0","statbuf.st_size",(int *)local_68,
             (long *)&statbuf.st_rdev);
  if ((char)statbuf.__glibc_reserved[2] == '\0') {
    testing::Message::Message((Message *)local_68);
    if (slots[0] == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)slots[0];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x226,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)slots);
  statbuf.__glibc_reserved[2] = 0;
  slots[1] = 0;
  slots[6] = 0;
  slots[3] = 0;
  slots[4] = 0;
  slots[0] = 3;
  slots[2] = 500000;
  slots[5] = 1;
  slots[7]._4_4_ = 2;
  std::__cxx11::string::string((string *)local_68,(string *)this_01);
  bVar1 = ProfileData::Start(this_00,(char *)CONCAT44(local_68._4_4_,local_68._0_4_),
                             (Options *)((long)slots + 0x3c));
  local_48.data_._0_4_ = CONCAT31(local_48.data_._1_3_,bVar1);
  gtest_ar__1.success_ = false;
  gtest_ar__1._1_7_ = 0;
  std::__cxx11::string::~string((string *)local_68);
  if (local_48.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_48,
               (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x22f,(char *)CONCAT44(local_68._4_4_,local_68._0_4_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff90,(Message *)&gtest_ar__1.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)local_68);
    if ((long *)CONCAT44(gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar__1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__1);
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  ProfileData::Stop(this_00);
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_((string *)local_68,this_01);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_48,"kNoError","checker_.ValidateProfile()",(char (*) [1])"",
             (string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  if (local_48.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (gtest_ar__1._0_8_ != 0) {
      pcVar2 = *(char **)gtest_ar__1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x233,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1.message_,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__1);
  (anonymous_namespace)::ProfileDataChecker::Check_abi_cxx11_
            ((string *)local_68,this_01,(ProfileDataSlot *)(statbuf.__glibc_reserved + 2),8);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_48,"kNoError",
             "checker_.Check(slots, (sizeof(slots) / sizeof(*(slots))))",(char (*) [1])"",
             (string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  if (local_48.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (gtest_ar__1._0_8_ != 0) {
      pcVar2 = *(char **)gtest_ar__1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1.message_,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    if ((long *)CONCAT44(local_68._4_4_,local_68._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68._4_4_,local_68._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__1);
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartResetRestart) {
  ExpectStopped();
  ProfileData::Options options;
  options.set_frequency(1);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Reset();
  ExpectStopped();
  // We expect the resulting file to be empty.  This is a minimal test
  // of ValidateProfile.
  EXPECT_NE(kNoError, checker_.ValidateProfile());

  struct stat statbuf;
  EXPECT_EQ(0, stat(checker_.filename().c_str(), &statbuf));
  EXPECT_EQ(0, statbuf.st_size);

  const int frequency = 2;  // Different frequency than used above.
  ProfileDataSlot slots[] = {
    0, 3, 0, 1000000 / frequency, 0,    // binary header
    0, 1, 0                             // binary trailer
  };

  options.set_frequency(frequency);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.Check(slots, arraysize(slots)));
}